

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Span.h
# Opt level: O2

void __thiscall
jaegertracing::Span::
doLog<std::vector<std::pair<opentracing::v3::string_view,opentracing::v3::Value>,std::allocator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>>>>
          (Span *this,SystemTime timestamp,
          vector<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>,_std::allocator<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>_>_>
          *fieldPairs)

{
  SystemTime timestamp_local;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> fields;
  
  timestamp_local = timestamp;
  std::mutex::lock(&this->_mutex);
  if (((this->_context)._flags & 1) != 0) {
    fields.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    fields.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    fields.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::reserve
              (&fields,((long)(fieldPairs->
                              super__Vector_base<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>,_std::allocator<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(fieldPairs->
                             super__Vector_base<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>,_std::allocator<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) / 0x38);
    std::
    transform<__gnu_cxx::__normal_iterator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>*,std::vector<std::pair<opentracing::v3::string_view,opentracing::v3::Value>,std::allocator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>>>>,std::back_insert_iterator<std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>,jaegertracing::Span::doLog<std::vector<std::pair<opentracing::v3::string_view,opentracing::v3::Value>,std::allocator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>>>>(std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::vector<std::pair<opentracing::v3::string_view,opentracing::v3::Value>,std::allocator<std::pair<opentracing::v3::string_view,opentracing::v3::Value>>>)::_lambda(std::pair<opentracing::v3::string_view,opentracing::v3::Value>const&)_1_>
              ((fieldPairs->
               super__Vector_base<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>,_std::allocator<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (fieldPairs->
               super__Vector_base<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>,_std::allocator<std::pair<opentracing::v3::string_view,_opentracing::v3::Value>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,&fields);
    logFieldsNoLocking<__gnu_cxx::__normal_iterator<jaegertracing::Tag*,std::vector<jaegertracing::Tag,std::allocator<jaegertracing::Tag>>>>
              (this,&timestamp_local,
               (__normal_iterator<jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
                )fields.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<jaegertracing::Tag_*,_std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>_>
                )fields.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&fields);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
  return;
}

Assistant:

void doLog(opentracing::SystemTime timestamp, Container fieldPairs) noexcept
    {
        std::lock_guard<std::mutex> lock(_mutex);
        if (!_context.isSampled()) {
            return;
        }

        std::vector<Tag> fields;
        fields.reserve(fieldPairs.size());
        std::transform(
            std::begin(fieldPairs),
            std::end(fieldPairs),
            std::back_inserter(fields),
            [](const std::pair<opentracing::string_view, opentracing::Value>&
                   pair) { return Tag(pair.first, pair.second); });
        logFieldsNoLocking(timestamp, std::begin(fields), std::end(fields));
    }